

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_123::AllReader::copyInto(AllReader *this,ArrayPtr<unsigned_char> out)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *__src;
  unsigned_long local_60;
  size_t local_58;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> local_50;
  size_t n;
  Array<unsigned_char> *part;
  Array<unsigned_char> *__end2;
  Array<unsigned_char> *__begin2;
  Vector<kj::Array<unsigned_char>_> *__range2;
  size_t pos;
  AllReader *this_local;
  ArrayPtr<unsigned_char> out_local;
  
  out_local.ptr = (uchar *)out.size_;
  this_local = (AllReader *)out.ptr;
  __range2 = (Vector<kj::Array<unsigned_char>_> *)0x0;
  __begin2 = (Array<unsigned_char> *)&this->parts;
  pos = (size_t)this;
  __end2 = Vector<kj::Array<unsigned_char>_>::begin((Vector<kj::Array<unsigned_char>_> *)__begin2);
  part = Vector<kj::Array<unsigned_char>_>::end((Vector<kj::Array<unsigned_char>_> *)__begin2);
  for (; __end2 != part; __end2 = __end2 + 1) {
    n = (size_t)__end2;
    local_58 = Array<unsigned_char>::size(__end2);
    sVar1 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
    local_60 = sVar1 - (long)__range2;
    local_50 = min<unsigned_long,unsigned_long>(&local_58,&local_60);
    puVar2 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
    puVar2 = puVar2 + (long)__range2;
    __src = Array<unsigned_char>::begin((Array<unsigned_char> *)n);
    memcpy(puVar2,__src,local_50);
    __range2 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range2->builder).ptr + local_50);
  }
  return;
}

Assistant:

void copyInto(ArrayPtr<byte> out) {
    size_t pos = 0;
    for (auto& part: parts) {
      size_t n = kj::min(part.size(), out.size() - pos);
      memcpy(out.begin() + pos, part.begin(), n);
      pos += n;
    }
  }